

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

FormulaUnit * __thiscall FOOLElimination::apply(FOOLElimination *this,FormulaUnit *unit)

{
  Formula *f;
  bool bVar1;
  FormulaUnit *this_00;
  Formula *f_00;
  ostream *poVar2;
  Inference IStack_68;
  NonspecificInferenceMany local_38;
  
  bVar1 = needsElimination(unit);
  this_00 = unit;
  if (bVar1) {
    this_00 = Shell::Rectify::rectify(unit,true);
    f = this_00->_formula;
    this->_unit = &this_00->super_Unit;
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (&this->_varSorts);
    Kernel::SortHelper::collectVariableSorts(f,&this->_varSorts,false);
    f_00 = process(this,f);
    if (f != f_00) {
      Lib::List<Kernel::Unit_*>::push(&this_00->super_Unit,&this->_currentDefs);
      this_00 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
      local_38.premises = this->_currentDefs;
      local_38.rule = FOOL_ELIMINATION;
      Kernel::Inference::Inference(&IStack_68,&local_38);
      Kernel::FormulaUnit::FormulaUnit(this_00,f_00,&IStack_68);
      this->_currentDefs = (UnitList *)0x0;
      if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa1d2) & 1) != 0)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"[PP] ");
        Kernel::FormulaUnit::toString_abi_cxx11_((string *)&IStack_68,unit);
        poVar2 = std::operator<<(poVar2,(string *)&IStack_68);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&IStack_68);
        poVar2 = std::operator<<((ostream *)&std::cout,"[PP] ");
        Kernel::FormulaUnit::toString_abi_cxx11_((string *)&IStack_68,this_00);
        poVar2 = std::operator<<(poVar2,(string *)&IStack_68);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&IStack_68);
      }
    }
  }
  return this_00;
}

Assistant:

FormulaUnit* FOOLElimination::apply(FormulaUnit* unit) {
  if (!needsElimination(unit)) {
    return unit;
  }

  FormulaUnit* rectifiedUnit = Rectify::rectify(unit);

  Formula* formula = rectifiedUnit->formula();

  _unit = rectifiedUnit;
  _varSorts.reset();

  SortHelper::collectVariableSorts(formula, _varSorts);

  Formula* processedFormula = process(formula);
  if (formula == processedFormula) {
    return rectifiedUnit;
  }

  // add the master premise to the definitions and pass them to the inference object
  UnitList::push(rectifiedUnit,_currentDefs);
  FormulaUnit* processedUnit = new FormulaUnit(processedFormula,
      NonspecificInferenceMany(InferenceRule::FOOL_ELIMINATION, _currentDefs));
  _currentDefs = UnitList::empty();

  if (env.options->showPreprocessing()) {
    std::cout << "[PP] " << unit->toString() << endl;
    std::cout << "[PP] " << processedUnit->toString()  << endl;
  }

  return processedUnit;
}